

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# CppLogger.cpp
# Opt level: O3

void __thiscall
CppLogger::CppLogger::setFormat
          (CppLogger *this,initializer_list<CppLogger::FormatAttribute> t_Format)

{
  FormatAttribute *pFVar1;
  void *pvVar2;
  FormatAttribute *pFVar3;
  long lVar4;
  Format local_48;
  
  pFVar1 = t_Format._M_array + t_Format._M_len;
  local_48.m_Format.
  super__Vector_base<CppLogger::FormatAttribute,_std::allocator<CppLogger::FormatAttribute>_>.
  _M_impl.super__Vector_impl_data._M_start._0_4_ = 4;
  pFVar3 = std::
           __find_if<CppLogger::FormatAttribute_const*,__gnu_cxx::__ops::_Iter_equals_val<CppLogger::FormatAttribute_const>>
                     (t_Format._M_array,pFVar1);
  lVar4 = 0;
  if (pFVar3 == pFVar1) {
    do {
      Format::Format(&local_48,t_Format);
      std::vector<CppLogger::FormatAttribute,_std::allocator<CppLogger::FormatAttribute>_>::
      operator=((vector<CppLogger::FormatAttribute,_std::allocator<CppLogger::FormatAttribute>_> *)
                (&this->field_0x28 + lVar4),&local_48.m_Format);
      pvVar2 = (void *)CONCAT44(local_48.m_Format.
                                super__Vector_base<CppLogger::FormatAttribute,_std::allocator<CppLogger::FormatAttribute>_>
                                ._M_impl.super__Vector_impl_data._M_start._4_4_,
                                local_48.m_Format.
                                super__Vector_base<CppLogger::FormatAttribute,_std::allocator<CppLogger::FormatAttribute>_>
                                ._M_impl.super__Vector_impl_data._M_start._0_4_);
      if (pvVar2 != (void *)0x0) {
        operator_delete(pvVar2,(long)local_48.m_Format.
                                     super__Vector_base<CppLogger::FormatAttribute,_std::allocator<CppLogger::FormatAttribute>_>
                                     ._M_impl.super__Vector_impl_data._M_end_of_storage -
                               (long)pvVar2);
      }
      Format::addMessage((Format *)(&this->field_0x28 + lVar4));
      lVar4 = lVar4 + 0x18;
    } while (lVar4 != 0x78);
  }
  else {
    do {
      Format::Format(&local_48,t_Format);
      std::vector<CppLogger::FormatAttribute,_std::allocator<CppLogger::FormatAttribute>_>::
      operator=((vector<CppLogger::FormatAttribute,_std::allocator<CppLogger::FormatAttribute>_> *)
                (&this->field_0x28 + lVar4),&local_48.m_Format);
      pvVar2 = (void *)CONCAT44(local_48.m_Format.
                                super__Vector_base<CppLogger::FormatAttribute,_std::allocator<CppLogger::FormatAttribute>_>
                                ._M_impl.super__Vector_impl_data._M_start._4_4_,
                                local_48.m_Format.
                                super__Vector_base<CppLogger::FormatAttribute,_std::allocator<CppLogger::FormatAttribute>_>
                                ._M_impl.super__Vector_impl_data._M_start._0_4_);
      if (pvVar2 != (void *)0x0) {
        operator_delete(pvVar2,(long)local_48.m_Format.
                                     super__Vector_base<CppLogger::FormatAttribute,_std::allocator<CppLogger::FormatAttribute>_>
                                     ._M_impl.super__Vector_impl_data._M_end_of_storage -
                               (long)pvVar2);
      }
      lVar4 = lVar4 + 0x18;
    } while (lVar4 != 0x78);
  }
  return;
}

Assistant:

void CppLogger::setFormat(std::initializer_list<FormatAttribute> t_Format) {
        if (std::find(t_Format.begin(), t_Format.end(), FormatAttribute::Message) == t_Format.end()) {
            for(auto &format : m_Format) {
                format = t_Format;
                format.addMessage();
            }
        } else {
            for (auto &format: m_Format)
                format = t_Format;
        }
    }